

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

void dec_set_mb_mi(CommonModeInfoParams *mi_params,int width,int height,
                  BLOCK_SIZE min_partition_size)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int aligned_height;
  int aligned_width;
  
  in_RDI[4] = (int)(in_ESI + 7U & 0xfffffff8) >> 2;
  in_RDI[3] = (int)(in_EDX + 7U & 0xfffffff8) >> 2;
  iVar1 = calc_mi_size(in_RDI[4]);
  in_RDI[0xf] = iVar1;
  in_RDI[1] = in_RDI[4] + 2 >> 2;
  *in_RDI = in_RDI[3] + 2 >> 2;
  in_RDI[2] = *in_RDI * in_RDI[1];
  *(undefined1 *)(in_RDI + 10) = 0;
  in_RDI[9] = in_RDI[0xf];
  return;
}

Assistant:

static void dec_set_mb_mi(CommonModeInfoParams *mi_params, int width,
                          int height, BLOCK_SIZE min_partition_size) {
  (void)min_partition_size;
  // Ensure that the decoded width and height are both multiples of
  // 8 luma pixels (note: this may only be a multiple of 4 chroma pixels if
  // subsampling is used).
  // This simplifies the implementation of various experiments,
  // eg. cdef, which operates on units of 8x8 luma pixels.
  const int aligned_width = ALIGN_POWER_OF_TWO(width, 3);
  const int aligned_height = ALIGN_POWER_OF_TWO(height, 3);

  mi_params->mi_cols = aligned_width >> MI_SIZE_LOG2;
  mi_params->mi_rows = aligned_height >> MI_SIZE_LOG2;
  mi_params->mi_stride = calc_mi_size(mi_params->mi_cols);

  mi_params->mb_cols = ROUND_POWER_OF_TWO(mi_params->mi_cols, 2);
  mi_params->mb_rows = ROUND_POWER_OF_TWO(mi_params->mi_rows, 2);
  mi_params->MBs = mi_params->mb_rows * mi_params->mb_cols;

  mi_params->mi_alloc_bsize = BLOCK_4X4;
  mi_params->mi_alloc_stride = mi_params->mi_stride;

  assert(mi_size_wide[mi_params->mi_alloc_bsize] ==
         mi_size_high[mi_params->mi_alloc_bsize]);
}